

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::unrollIndent(Scanner *this,int ToColumn)

{
  int iVar1;
  undefined1 local_70 [8];
  Token T;
  int ToColumn_local;
  Scanner *this_local;
  
  T.Value.field_2._12_4_ = ToColumn;
  Token::Token((Token *)local_70);
  if (this->FlowLevel == 0) {
    while ((int)T.Value.field_2._12_4_ < this->Indent) {
      local_70._0_4_ = TK_BlockEnd;
      T._0_8_ = this->Current;
      T.Range.Data = (char *)0x1;
      AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
      ::push_back(&this->TokenQueue,(Token *)local_70);
      iVar1 = SmallVectorImpl<int>::pop_back_val(&(this->Indents).super_SmallVectorImpl<int>);
      this->Indent = iVar1;
    }
  }
  Token::~Token((Token *)local_70);
  return true;
}

Assistant:

bool Scanner::unrollIndent(int ToColumn) {
  Token T;
  // Indentation is ignored in flow.
  if (FlowLevel != 0)
    return true;

  while (Indent > ToColumn) {
    T.Kind = Token::TK_BlockEnd;
    T.Range = StringRef(Current, 1);
    TokenQueue.push_back(T);
    Indent = Indents.pop_back_val();
  }

  return true;
}